

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

token * toplevel_asm_declaration(dmr_C *C,token *token,symbol_list **list)

{
  position pVar1;
  symbol *ptr;
  symbol *psVar2;
  statement *stmt;
  token *ptVar3;
  
  ptr = dmrC_alloc_symbol(C->S,token->pos,3);
  psVar2 = dmrC_alloc_symbol(C->S,token->pos,5);
  (ptr->field_14).field_2.ctype.base_type = psVar2;
  pVar1 = token->pos;
  stmt = (statement *)dmrC_allocator_allocate(&C->statement_allocator,0);
  stmt->type = STMT_NONE;
  stmt->pos = pVar1;
  (psVar2->field_14).field_2.stmt = stmt;
  ptVar3 = parse_asm_statement(C,token,stmt);
  ptrlist_add((ptr_list **)list,ptr,&C->ptrlist_allocator);
  return ptVar3;
}

Assistant:

static struct token *toplevel_asm_declaration(struct dmr_C *C, struct token *token, struct symbol_list **list)
{
	struct symbol *anon = dmrC_alloc_symbol(C->S, token->pos, SYM_NODE);
	struct symbol *fn = dmrC_alloc_symbol(C->S, token->pos, SYM_FN);
	struct statement *stmt;

	anon->ctype.base_type = fn;
	stmt = dmrC_alloc_statement(C, token->pos, STMT_NONE);
	fn->stmt = stmt;

	token = parse_asm_statement(C, token, stmt);

	dmrC_add_symbol(C, list, anon);
	return token;
}